

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HtmlBuilder.h
# Opt level: O2

void __thiscall HTML::HEAD::HEAD(HEAD *this,ostream *stream)

{
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"HEAD",&local_39);
  TAG::TAG(&this->super_TAG,&local_38,stream);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_TAG)._vptr_TAG = (_func_int **)&PTR__TAG_001ef060;
  return;
}

Assistant:

HEAD( std::ostream& stream )
  : TAG( "HEAD", stream ) {}